

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
     ::doEndLoop(SpillPointers *self,Expression **currp)

{
  LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *this;
  pointer *pppBVar1;
  BasicBlock *pBVar2;
  Expression *pEVar3;
  pointer ppBVar4;
  map<wasm::Expression_*,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
  *this_00;
  BasicBlock *__to;
  mapped_type *pmVar5;
  pointer ppBVar6;
  pair<std::_Rb_tree_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>,_std::_Rb_tree_iterator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
  pVar7;
  Expression *local_48;
  SpillPointers *local_40;
  map<wasm::Expression_*,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
  *local_38;
  
  this = &(self->
          super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
          ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>;
  pBVar2 = (self->
           super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
           ).super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>.
           super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
           .currBasicBlock;
  __to = startBasicBlock(&this->
                          super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                        );
  link(&this->
        super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
       ,(char *)pBVar2,(char *)__to);
  pEVar3 = *currp;
  if (pEVar3->_id == LoopId) {
    if (pEVar3[1].type.id != 0) {
      pBVar2 = (*(pointer *)
                 ((long)&(self->
                         super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                         ).
                         super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                         .
                         super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                         .loopStack.
                         super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                         ._M_impl.super__Vector_impl_data + 8))[-1];
      local_38 = &(self->
                  super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                  ).
                  super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                  .
                  super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                  .branches;
      local_48 = pEVar3;
      local_40 = self;
      pmVar5 = std::
               map<wasm::Expression_*,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
               ::operator[](local_38,&local_48);
      ppBVar4 = (pmVar5->
                super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      for (ppBVar6 = (pmVar5->
                     super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     )._M_impl.super__Vector_impl_data._M_start; this_00 = local_38,
          ppBVar6 != ppBVar4; ppBVar6 = ppBVar6 + 1) {
        link(&this->
              super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
             ,(char *)*ppBVar6,(char *)pBVar2);
      }
      local_48 = pEVar3;
      pVar7 = std::
              _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>,_std::_Select1st<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
              ::equal_range(&local_38->_M_t,&local_48);
      std::
      _Rb_tree<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>,_std::_Select1st<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node);
      self = local_40;
    }
    pppBVar1 = (pointer *)
               ((long)&(self->
                       super_WalkerPass<wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>_>
                       ).
                       super_LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>
                       .
                       super_CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>
                       .loopStack.
                       super__Vector_base<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
    *pppBVar1 = *pppBVar1 + -1;
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                ,0x314,"T *wasm::Expression::cast() [T = wasm::Loop]");
}

Assistant:

static void doEndLoop(SubType* self, Expression** currp) {
    auto* last = self->currBasicBlock;
    self->link(last, self->startBasicBlock()); // fallthrough
    auto* curr = (*currp)->cast<Loop>();
    // branches to the top of the loop
    if (curr->name.is()) {
      auto* loopStart = self->loopStack.back();
      auto& origins = self->branches[curr];
      for (auto* origin : origins) {
        self->link(origin, loopStart);
      }
      self->branches.erase(curr);
    }
    self->loopStack.pop_back();
  }